

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

void ZSTD_DCtx_trace_end(ZSTD_DCtx *dctx,U64 uncompressedSize,U64 compressedSize,uint streaming)

{
  ZSTD_TraceCtx ZVar1;
  
  ZVar1 = dctx->traceCtx;
  if (ZVar1 != 0) {
    if (dctx->ddict != (ZSTD_DDict *)0x0) {
      ZSTD_getDictID_fromDDict(dctx->ddict);
      ZSTD_DDict_dictSize(dctx->ddict);
      ZVar1 = dctx->traceCtx;
    }
    ZSTD_trace_decompress_end(ZVar1);
  }
  return;
}

Assistant:

static void ZSTD_DCtx_trace_end(ZSTD_DCtx const* dctx, U64 uncompressedSize, U64 compressedSize, unsigned streaming)
{
#if ZSTD_TRACE
    if (dctx->traceCtx && ZSTD_trace_decompress_end != NULL) {
        ZSTD_Trace trace;
        ZSTD_memset(&trace, 0, sizeof(trace));
        trace.version = ZSTD_VERSION_NUMBER;
        trace.streaming = streaming;
        if (dctx->ddict) {
            trace.dictionaryID = ZSTD_getDictID_fromDDict(dctx->ddict);
            trace.dictionarySize = ZSTD_DDict_dictSize(dctx->ddict);
            trace.dictionaryIsCold = dctx->ddictIsCold;
        }
        trace.uncompressedSize = (size_t)uncompressedSize;
        trace.compressedSize = (size_t)compressedSize;
        trace.dctx = dctx;
        ZSTD_trace_decompress_end(dctx->traceCtx, &trace);
    }
#else
    (void)dctx;
    (void)uncompressedSize;
    (void)compressedSize;
    (void)streaming;
#endif
}